

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime.cpp
# Opt level: O0

tm * booster::local_time(time_t pt)

{
  tm *ptVar1;
  undefined8 uVar2;
  tm *in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  allocator local_29;
  string local_28 [32];
  time_t local_8;
  
  ptVar1 = localtime_r(&local_8,in_RDI);
  if (ptVar1 == (tm *)0x0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,"booster::local_time: Failed to convert time to local time",&local_29);
    runtime_error::runtime_error
              ((runtime_error *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),(string *)in_RDI);
    __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  return (tm *)in_RDI;
}

Assistant:

std::tm local_time(time_t pt)
{
	#ifdef BOOSTER_WIN_NATIVE
	// WIN32 Uses TSL
	std::tm *res=::localtime(&pt);
	if(!res)
		throw runtime_error("booster::local_time: Failed to convert time to local time");
	return *res;
	#else
	std::tm tm;
	if(!::localtime_r(&pt,&tm)) {
		throw runtime_error("booster::local_time: Failed to convert time to local time");
	}
	return tm;
	#endif
}